

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O2

AspifOutput * __thiscall Potassco::AspifOutput::add(AspifOutput *this,WeightLitSpan *lits)

{
  ostream *poVar1;
  WeightLit_t *pWVar2;
  WeightLit_t *pWVar3;
  
  poVar1 = std::operator<<(this->os_," ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  pWVar2 = lits->first;
  for (pWVar3 = pWVar2; pWVar3 != pWVar2 + lits->size; pWVar3 = pWVar3 + 1) {
    poVar1 = std::operator<<(this->os_," ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,pWVar3->lit);
    poVar1 = std::operator<<(poVar1," ");
    std::ostream::operator<<((ostream *)poVar1,pWVar3->weight);
    pWVar2 = lits->first;
  }
  return this;
}

Assistant:

AspifOutput& AspifOutput::add(const WeightLitSpan& lits) {
	os_ << " " << size(lits);
	for (const WeightLit_t* x = begin(lits); x != end(lits); ++x) {
		os_ << " " << lit(*x) << " " << weight(*x);
	}
	return *this;
}